

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O0

bool __thiscall
Js::JavascriptRegExpConstructor::SetPropertyBuiltIns
          (JavascriptRegExpConstructor *this,PropertyId propertyId,Var value,BOOL *result)

{
  ScriptContext *pSVar1;
  JavascriptString *ptr;
  ThreadContext *this_00;
  JavascriptString *tempInput;
  BOOL *result_local;
  Var value_local;
  PropertyId propertyId_local;
  JavascriptRegExpConstructor *this_local;
  
  if (propertyId == 0x1d0) {
LAB_0130af9b:
    pSVar1 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    ptr = JavascriptConversion::ToString(value,pSVar1);
    EnsureValues(this);
    Memory::WriteBarrierPtr<Js::JavascriptString>::operator=(&this->lastInput,ptr);
    pSVar1 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    this_00 = ScriptContext::GetThreadContext(pSVar1);
    ThreadContext::AddImplicitCallFlags(this_00,ImplicitCall_Accessor);
    *result = 1;
  }
  else {
    if (9 < propertyId - 0x1d1U) {
      if (propertyId == 0x1db) goto LAB_0130af9b;
      if ((3 < propertyId - 0x1dcU) && (3 < propertyId - 0x1e3U)) {
        return false;
      }
    }
    *result = 0;
  }
  return true;
}

Assistant:

bool JavascriptRegExpConstructor::SetPropertyBuiltIns(PropertyId propertyId, Var value, BOOL* result)
    {
        switch (propertyId)
        {
        case PropertyIds::input:
        case PropertyIds::$_:
            //TODO: review: although the 'input' property is marked as readonly, it has a set on V5.8. There is no spec on this.
            {
                auto tempInput = JavascriptConversion::ToString(value, this->GetScriptContext());
                // Above toString call can cause user code to be called, which may call .match to invalidate our state, ensure that we have proper values in case that happens.
                EnsureValues(); // The last match info relies on the last input. Use it before it is changed.
                this->lastInput = tempInput;
            }

            // Set implicit call flags since we are not necessarily making the original stored value available on re-load
            // and are killing the store that backs two exposed properties.
            this->GetScriptContext()->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_Accessor);
            *result = true;
            return true;
        case PropertyIds::lastMatch:
        case PropertyIds::$Ampersand:
        case PropertyIds::lastParen:
        case PropertyIds::$Plus:
        case PropertyIds::leftContext:
        case PropertyIds::$BackTick:
        case PropertyIds::rightContext:
        case PropertyIds::$Tick:
        case PropertyIds::$1:
        case PropertyIds::$2:
        case PropertyIds::$3:
        case PropertyIds::$4:
        case PropertyIds::$5:
        case PropertyIds::$6:
        case PropertyIds::$7:
        case PropertyIds::$8:
        case PropertyIds::$9:
        case PropertyIds::index:
            *result = false;
            return true;
        default:
            return false;
        }
    }